

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

void __thiscall miniros::Subscription::dropAllConnections(Subscription *this)

{
  pointer psVar1;
  int iVar2;
  pointer psVar3;
  V_PublisherLink localsubscribers;
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->publisher_links_mutex_);
  if (iVar2 == 0) {
    psVar3 = (this->publisher_links_).
             super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->publisher_links_).
             super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->publisher_links_).
         super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->publisher_links_).
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->publisher_links_).
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->publisher_links_).
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar3;
    local_38.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->publisher_links_mutex_);
    for (; psVar3 != psVar1; psVar3 = psVar3 + 1) {
      (*((psVar3->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_PublisherLink[5])();
    }
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::~vector(&local_38);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void Subscription::dropAllConnections()
{
  // Swap our subscribers list with a local one so we can only lock for a short period of time, because a
  // side effect of our calling drop() on connections can be re-locking the subscribers mutex
  V_PublisherLink localsubscribers;

  {
    std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

    localsubscribers.swap(publisher_links_);
  }

  V_PublisherLink::iterator it = localsubscribers.begin();
  V_PublisherLink::iterator end = localsubscribers.end();
  for (;it != end; ++it)
  {
    (*it)->drop();
  }
}